

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O2

int Abc_NtkGetCubeNum(Abc_Ntk_t *pNtk)

{
  uint __line;
  int iVar1;
  Abc_Obj_t *pNode;
  int i;
  char *__assertion;
  int iVar2;
  
  if (pNtk->ntkFunc != ABC_FUNC_SOP) {
    __assertion = "Abc_NtkHasSop(pNtk)";
    __line = 0x77;
LAB_001dfaef:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcUtil.c"
                  ,__line,"int Abc_NtkGetCubeNum(Abc_Ntk_t *)");
  }
  i = 0;
  iVar2 = 0;
  do {
    if (pNtk->vObjs->nSize <= i) {
      return iVar2;
    }
    pNode = Abc_NtkObj(pNtk,i);
    if ((pNode != (Abc_Obj_t *)0x0) && ((*(uint *)&pNode->field_0x14 & 0xf) == 7)) {
      iVar1 = Abc_NodeIsConst(pNode);
      if (iVar1 == 0) {
        if ((char *)(pNode->field_5).pData == (char *)0x0) {
          __assertion = "pNode->pData";
          __line = 0x7c;
          goto LAB_001dfaef;
        }
        iVar1 = Abc_SopGetCubeNum((char *)(pNode->field_5).pData);
        iVar2 = iVar2 + iVar1;
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

int Abc_NtkGetCubeNum( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode;
    int i, nCubes = 0;
    assert( Abc_NtkHasSop(pNtk) );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        if ( Abc_NodeIsConst(pNode) )
            continue;
        assert( pNode->pData );
        nCubes += Abc_SopGetCubeNum( (char *)pNode->pData );
    }
    return nCubes;
}